

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

int lj_cparse(CPState *cp)

{
  CTypeID CVar1;
  MSize MVar2;
  CTState *pCVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  undefined1 local_1e4 [204];
  undefined1 local_118 [256];
  
  CVar1 = cp->cts->top;
  memcpy(local_1e4,&cp->cts->sizetab,0x1cc);
  iVar5 = lj_vm_cpcall(cp->L,0,cp,cpcparser);
  if (iVar5 != 0) {
    pCVar3 = cp->cts;
    pCVar3->top = CVar1;
    memcpy(pCVar3->hash,local_118,0x100);
  }
  uVar6 = (ulong)(cp->L->glref).ptr32;
  pcVar4 = (cp->sb).buf;
  MVar2 = (cp->sb).sz;
  *(int *)(uVar6 + 0x20) = *(int *)(uVar6 + 0x20) - MVar2;
  (**(code **)(uVar6 + 0x10))(*(undefined8 *)(uVar6 + 0x18),pcVar4,MVar2,0);
  return iVar5;
}

Assistant:

int lj_cparse(CPState *cp)
{
  LJ_CTYPE_SAVE(cp->cts);
  int errcode = lj_vm_cpcall(cp->L, NULL, cp, cpcparser);
  if (errcode)
    LJ_CTYPE_RESTORE(cp->cts);
  cp_cleanup(cp);
  return errcode;
}